

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding_map.cpp
# Opt level: O3

void __thiscall r_exec::HLPBindingMap::init_from_f_ihlp(HLPBindingMap *this,_Fact *f_ihlp)

{
  short sVar1;
  ObjectValue *pOVar2;
  AtomValue *pAVar3;
  StructureValue *pSVar4;
  atomic_int_fast64_t *paVar5;
  byte bVar6;
  char cVar7;
  undefined1 uVar8;
  ushort uVar9;
  uint16_t uVar10;
  int iVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectValue *pOVar12;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  AtomValue *pAVar13;
  StructureValue *pSVar14;
  pointer pPVar15;
  pointer pPVar16;
  ulong uVar17;
  Atom atom;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined8 local_48;
  Code *local_40;
  ulong local_38;
  Code *source;
  
  local_40 = (Code *)f_ihlp;
  iVar11 = (*(f_ihlp->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
             super_Code.super__Object._vptr__Object[9])(f_ihlp,0);
  source = (Code *)CONCAT44(extraout_var,iVar11);
  (*(source->super__Object)._vptr__Object[4])(source,2);
  uVar9 = r_code::Atom::asIndex();
  (*(source->super__Object)._vptr__Object[4])(source,(ulong)uVar9);
  bVar6 = r_code::Atom::getAtomCount();
  if (bVar6 != 0) {
    local_38 = (ulong)bVar6;
    local_48 = (ulong)(ushort)(uVar9 + 1);
    uVar17 = 0;
    do {
      iVar11 = (*(source->super__Object)._vptr__Object[4])
                         (source,(ulong)((int)local_48 + (int)uVar17 & 0xffff));
      local_54 = *(undefined4 *)CONCAT44(extraout_var_00,iVar11);
      cVar7 = r_code::Atom::getDescriptor();
      if (cVar7 == -0x7c) {
        pOVar12 = (ObjectValue *)operator_new(0x20);
        uVar10 = r_code::Atom::asIndex();
        StructureValue::StructureValue
                  ((StructureValue *)pOVar12,&this->super_BindingMap,source,uVar10);
LAB_0015a057:
        pPVar15 = (this->super_BindingMap).map.
                  super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pOVar2 = (ObjectValue *)pPVar15[uVar17].object;
        if (pOVar2 != pOVar12) {
          if (pOVar2 != (ObjectValue *)0x0) {
            LOCK();
            paVar5 = &(pOVar2->super_BoundValue).super_Value.super__Object.refCount;
            (paVar5->super___atomic_base<long>)._M_i = (paVar5->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if ((pOVar2->super_BoundValue).super_Value.super__Object.refCount.
                super___atomic_base<long>._M_i < 1) {
              (*(pOVar2->super_BoundValue).super_Value.super__Object._vptr__Object[1])();
            }
          }
          pPVar15[uVar17].object = (_Object *)pOVar12;
          LOCK();
          paVar5 = &(pOVar12->super_BoundValue).super_Value.super__Object.refCount;
          (paVar5->super___atomic_base<long>)._M_i = (paVar5->super___atomic_base<long>)._M_i + 1;
          UNLOCK();
        }
      }
      else {
        if (cVar7 == -0x7b) {
          pOVar12 = (ObjectValue *)operator_new(0x20);
          uVar9 = r_code::Atom::asIndex();
          iVar11 = (*(source->super__Object)._vptr__Object[9])(source,(ulong)uVar9);
          ObjectValue::ObjectValue
                    (pOVar12,&this->super_BindingMap,(Code *)CONCAT44(extraout_var_01,iVar11));
          goto LAB_0015a057;
        }
        pAVar13 = (AtomValue *)operator_new(0x20);
        local_4c = local_54;
        AtomValue::AtomValue(pAVar13,&this->super_BindingMap,(Atom *)&local_4c);
        pPVar15 = (this->super_BindingMap).map.
                  super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pAVar3 = (AtomValue *)pPVar15[uVar17].object;
        if (pAVar3 != pAVar13) {
          if (pAVar3 != (AtomValue *)0x0) {
            LOCK();
            paVar5 = &(pAVar3->super_BoundValue).super_Value.super__Object.refCount;
            (paVar5->super___atomic_base<long>)._M_i = (paVar5->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if ((pAVar3->super_BoundValue).super_Value.super__Object.refCount.
                super___atomic_base<long>._M_i < 1) {
              (*(pAVar3->super_BoundValue).super_Value.super__Object._vptr__Object[1])();
            }
          }
          pPVar15[uVar17].object = (_Object *)pAVar13;
          LOCK();
          paVar5 = &(pAVar13->super_BoundValue).super_Value.super__Object.refCount;
          (paVar5->super___atomic_base<long>)._M_i = (paVar5->super___atomic_base<long>)._M_i + 1;
          UNLOCK();
        }
        r_code::Atom::~Atom((Atom *)&local_4c);
      }
      r_code::Atom::~Atom((Atom *)&local_54);
      uVar17 = uVar17 + 1;
    } while (local_38 != uVar17);
  }
  (*(source->super__Object)._vptr__Object[4])(source,3);
  iVar11 = r_code::Atom::asIndex();
  uVar17 = (ulong)(this->super_BindingMap).first_index;
  pPVar15 = (this->super_BindingMap).map.
            super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pPVar16 = (this->super_BindingMap).map.
            super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (uVar17 < (ulong)((long)pPVar16 - (long)pPVar15 >> 3)) {
    local_48 = CONCAT44(local_48._4_4_,iVar11 + 1) & 0xffffffff0000ffff;
    do {
      uVar9 = (this->super_BindingMap).fwd_after_index;
      if ((0 < (short)uVar9 && uVar17 == uVar9) ||
         (uVar9 = (this->super_BindingMap).fwd_before_index, 0 < (short)uVar9 && uVar17 == uVar9))
      goto LAB_0015a2bc;
      iVar11 = (*(source->super__Object)._vptr__Object[4])(source,local_48 & 0xffffffff);
      local_54 = *(undefined4 *)CONCAT44(extraout_var_02,iVar11);
      uVar8 = r_code::Atom::getDescriptor();
      switch(uVar8) {
      case 0x82:
      case 0x83:
      case 0x86:
        break;
      case 0x84:
        pOVar12 = (ObjectValue *)operator_new(0x20);
        uVar10 = r_code::Atom::asIndex();
        StructureValue::StructureValue
                  ((StructureValue *)pOVar12,&this->super_BindingMap,source,uVar10);
        goto LAB_0015a215;
      case 0x85:
        pOVar12 = (ObjectValue *)operator_new(0x20);
        uVar9 = r_code::Atom::asIndex();
        iVar11 = (*(source->super__Object)._vptr__Object[9])(source,(ulong)uVar9);
        ObjectValue::ObjectValue
                  (pOVar12,&this->super_BindingMap,(Code *)CONCAT44(extraout_var_03,iVar11));
LAB_0015a215:
        pPVar15 = (this->super_BindingMap).map.
                  super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pOVar2 = (ObjectValue *)pPVar15[uVar17].object;
        if (pOVar2 != pOVar12) {
          if (pOVar2 != (ObjectValue *)0x0) {
            LOCK();
            paVar5 = &(pOVar2->super_BoundValue).super_Value.super__Object.refCount;
            (paVar5->super___atomic_base<long>)._M_i = (paVar5->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if ((pOVar2->super_BoundValue).super_Value.super__Object.refCount.
                super___atomic_base<long>._M_i < 1) {
              (*(pOVar2->super_BoundValue).super_Value.super__Object._vptr__Object[1])();
            }
          }
          pPVar15[uVar17].object = (_Object *)pOVar12;
          LOCK();
          paVar5 = &(pOVar12->super_BoundValue).super_Value.super__Object.refCount;
          (paVar5->super___atomic_base<long>)._M_i = (paVar5->super___atomic_base<long>)._M_i + 1;
          UNLOCK();
        }
        break;
      default:
        pAVar13 = (AtomValue *)operator_new(0x20);
        local_50 = local_54;
        AtomValue::AtomValue(pAVar13,&this->super_BindingMap,(Atom *)&local_50);
        pPVar15 = (this->super_BindingMap).map.
                  super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pAVar3 = (AtomValue *)pPVar15[uVar17].object;
        if (pAVar3 != pAVar13) {
          if (pAVar3 != (AtomValue *)0x0) {
            LOCK();
            paVar5 = &(pAVar3->super_BoundValue).super_Value.super__Object.refCount;
            (paVar5->super___atomic_base<long>)._M_i = (paVar5->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if ((pAVar3->super_BoundValue).super_Value.super__Object.refCount.
                super___atomic_base<long>._M_i < 1) {
              (*(pAVar3->super_BoundValue).super_Value.super__Object._vptr__Object[1])();
            }
          }
          pPVar15[uVar17].object = (_Object *)pAVar13;
          LOCK();
          paVar5 = &(pAVar13->super_BoundValue).super_Value.super__Object.refCount;
          (paVar5->super___atomic_base<long>)._M_i = (paVar5->super___atomic_base<long>)._M_i + 1;
          UNLOCK();
        }
        r_code::Atom::~Atom((Atom *)&local_50);
      }
      r_code::Atom::~Atom((Atom *)&local_54);
      pPVar15 = (this->super_BindingMap).map.
                super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pPVar16 = (this->super_BindingMap).map.
                super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
LAB_0015a2bc:
      uVar17 = uVar17 + 1;
    } while (uVar17 < (ulong)((long)pPVar16 - (long)pPVar15 >> 3));
  }
  pSVar14 = (StructureValue *)operator_new(0x20);
  StructureValue::StructureValue(pSVar14,&this->super_BindingMap,local_40,2);
  sVar1 = (this->super_BindingMap).fwd_after_index;
  pPVar15 = (this->super_BindingMap).map.
            super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pSVar4 = (StructureValue *)pPVar15[sVar1].object;
  if (pSVar4 != pSVar14) {
    if (pSVar4 != (StructureValue *)0x0) {
      LOCK();
      paVar5 = &(pSVar4->super_BoundValue).super_Value.super__Object.refCount;
      (paVar5->super___atomic_base<long>)._M_i = (paVar5->super___atomic_base<long>)._M_i + -1;
      UNLOCK();
      if ((pSVar4->super_BoundValue).super_Value.super__Object.refCount.super___atomic_base<long>.
          _M_i < 1) {
        (*(pSVar4->super_BoundValue).super_Value.super__Object._vptr__Object[1])();
      }
    }
    pPVar15[sVar1].object = (_Object *)pSVar14;
    LOCK();
    paVar5 = &(pSVar14->super_BoundValue).super_Value.super__Object.refCount;
    (paVar5->super___atomic_base<long>)._M_i = (paVar5->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  pSVar14 = (StructureValue *)operator_new(0x20);
  StructureValue::StructureValue(pSVar14,&this->super_BindingMap,local_40,3);
  sVar1 = (this->super_BindingMap).fwd_before_index;
  pPVar15 = (this->super_BindingMap).map.
            super__Vector_base<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pSVar4 = (StructureValue *)pPVar15[sVar1].object;
  if (pSVar4 != pSVar14) {
    if (pSVar4 != (StructureValue *)0x0) {
      LOCK();
      paVar5 = &(pSVar4->super_BoundValue).super_Value.super__Object.refCount;
      (paVar5->super___atomic_base<long>)._M_i = (paVar5->super___atomic_base<long>)._M_i + -1;
      UNLOCK();
      if ((pSVar4->super_BoundValue).super_Value.super__Object.refCount.super___atomic_base<long>.
          _M_i < 1) {
        (*(pSVar4->super_BoundValue).super_Value.super__Object._vptr__Object[1])();
      }
    }
    pPVar15[sVar1].object = (_Object *)pSVar14;
    LOCK();
    paVar5 = &(pSVar14->super_BoundValue).super_Value.super__Object.refCount;
    (paVar5->super___atomic_base<long>)._M_i = (paVar5->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  return;
}

Assistant:

void HLPBindingMap::init_from_f_ihlp(const _Fact *f_ihlp)   // source is f->icst or f->imdl; map already initialized with values from hlp.
{
    Code *ihlp = f_ihlp->get_reference(0);
    uint16_t tpl_val_set_index = ihlp->code(I_HLP_TPL_ARGS).asIndex();
    uint16_t tpl_val_count = ihlp->code(tpl_val_set_index++).getAtomCount();

    for (uint16_t i = 0; i < tpl_val_count; ++i) { // valuate tpl args.
        Atom atom = ihlp->code(tpl_val_set_index + i);

        switch (atom.getDescriptor()) {
        case Atom::R_PTR:
            map[i] = new ObjectValue(this, ihlp->get_reference(atom.asIndex()));
            break;

        case Atom::I_PTR:
            map[i] = new StructureValue(this, ihlp, atom.asIndex());
            break;

        default:
            map[i] = new AtomValue(this, atom);
            break;
        }
    }

    uint16_t val_set_index = ihlp->code(I_HLP_ARGS).asIndex() + 1;
    uint64_t i = 0;

    for (uint64_t j = first_index; j < map.size(); ++j) { // valuate args.
        if ((fwd_after_index > 0 && j == uint64_t(fwd_after_index)) || (fwd_before_index > 0 && j == uint64_t(fwd_before_index))) {
            continue;
        }

        Atom atom = ihlp->code(val_set_index + i);

        switch (atom.getDescriptor()) {
        case Atom::R_PTR:
            map[j] = new ObjectValue(this, ihlp->get_reference(atom.asIndex()));
            break;

        case Atom::I_PTR:
            map[j] = new StructureValue(this, ihlp, atom.asIndex());
            break;

        case Atom::WILDCARD:
        case Atom::T_WILDCARD:
        case Atom::VL_PTR:
            break;

        default:
            map[j] = new AtomValue(this, atom);
            break;
        }
    }

    map[fwd_after_index] = new StructureValue(this, f_ihlp, FACT_AFTER); // valuate timings; fwd_after_index is already known.
    map[fwd_before_index] = new StructureValue(this, f_ihlp, FACT_BEFORE);
}